

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  long lVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined1 *v_00;
  uint uVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  v_00 = (undefined1 *)(v_max & 0xffffffffffffff00);
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar6 = (flags & 0x100000U) >> 0x14;
  uVar4 = data_type & 0xfffffffe;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar3 = IsMousePosValid((ImVec2 *)0x0), bVar3)) &&
     (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), bVar3)) {
    fVar11 = (float)(pIVar2->IO).KeyMap[(ulong)uVar6 - 2];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar11 = fVar11 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar11 = fVar11 * 10.0;
    }
  }
  else {
    fVar11 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar7 = 0;
      if (uVar4 == 8) {
        uVar7 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(6,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar11 = (&local_38.x)[uVar6];
      if ((int)uVar7 < 0) {
        fVar10 = 1.1754944e-38;
      }
      else if ((int)uVar7 < 10) {
        v_00 = GetMinimumStepAtDecimalPrecision(int)::min_steps;
        fVar10 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar7 * 4);
      }
      else {
        fVar10 = powf(10.0,(float)(int)-uVar7);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar10 <= v_speed) |
                       ~-(uint)(fVar10 <= v_speed) & (uint)fVar10);
    }
  }
  fVar11 = fVar11 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar11 = -fVar11;
  }
  if (((flags & 0x20U) != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar11 = fVar11 / (float)(v_max - v_min);
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (v_00 = (undefined1 *)CONCAT71((int7)((ulong)v_00 >> 8),1), fVar11 <= 0.0))
    {
      v_00 = (undefined1 *)CONCAT71((int7)((ulong)v_00 >> 8),fVar11 < 0.0 && *v <= v_min);
    }
  }
  else {
    v_00 = (undefined1 *)0x0;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && ((char)v_00 == '\0')) {
    if ((fVar11 == 0.0) && (!NAN(fVar11))) goto LAB_001b411d;
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar11;
    bVar3 = true;
  }
  else {
    pIVar2->DragCurrentAccum = 0.0;
    bVar3 = false;
  }
  pIVar2->DragCurrentAccumDirty = bVar3;
LAB_001b411d:
  if (pIVar2->DragCurrentAccumDirty == true) {
    lVar8 = *v;
    if ((flags & 0x20U) == 0) {
      lVar8 = lVar8 + (long)pIVar2->DragCurrentAccum;
      fVar9 = 0.0;
      fVar10 = 0.0;
    }
    else {
      if (uVar4 == 8) {
        iVar5 = ImParseFormatPrecision(format,3);
        fVar10 = (float)iVar5;
      }
      else {
        fVar10 = 1.0;
      }
      fVar9 = powf(0.1,fVar10);
      fVar10 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lVar8,v_min,v_max,true,fVar9,0.0);
      v_00 = (undefined1 *)0x1;
      lVar8 = ScaleValueFromRatioT<long_long,long_long,double>
                        (data_type,pIVar2->DragCurrentAccum + fVar10,v_min,v_max,true,fVar9,0.0);
    }
    if ((flags & 0x40U) == 0) {
      lVar8 = RoundScalarWithFormatT<long_long,long_long>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)lVar8,
                         (longlong)v_00);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      fVar9 = (float)(lVar8 - *v);
    }
    else {
      fVar9 = ScaleRatioFromValueT<long_long,long_long,double>
                        (data_type,lVar8,v_min,v_max,true,fVar9,0.0);
      fVar9 = fVar9 - fVar10;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar9;
    lVar1 = *v;
    if ((v_min < v_max) && (lVar1 != lVar8)) {
      if ((lVar8 < v_min) || (((uVar4 != 8 && (lVar1 < lVar8)) && (fVar11 < 0.0)))) {
        lVar8 = v_min;
      }
      if ((v_max < lVar8) || (((uVar4 != 8 && (lVar8 < lVar1)) && (0.0 < fVar11)))) {
        lVar8 = v_max;
      }
    }
    bVar3 = lVar1 != lVar8;
    if (bVar3) {
      *v = lVar8;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}